

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS
ref_mpi_balance(REF_MPI ref_mpi,REF_INT ldim,REF_INT nitem,void *items,REF_INT first_rank,
               REF_INT last_rank,REF_INT *nbalanced,void **balanced,REF_TYPE type)

{
  uint uVar1;
  uint uVar2;
  REF_INT RVar3;
  void *array;
  REF_INT *proc;
  long lVar4;
  int local_94;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  int local_78;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT active;
  REF_INT i;
  REF_INT part;
  REF_INT offset;
  REF_INT *destination;
  REF_INT *haves;
  int local_40;
  REF_INT remainder;
  REF_INT share;
  REF_INT total;
  REF_INT *shares;
  REF_INT last_rank_local;
  REF_INT first_rank_local;
  void *items_local;
  REF_INT nitem_local;
  REF_INT ldim_local;
  REF_MPI ref_mpi_local;
  
  uVar1 = (last_rank - first_rank) + 1;
  remainder = nitem;
  shares._0_4_ = last_rank;
  shares._4_4_ = first_rank;
  _last_rank_local = items;
  items_local._0_4_ = nitem;
  items_local._4_4_ = ldim;
  _nitem_local = ref_mpi;
  uVar2 = ref_mpi_allsum(ref_mpi,&remainder,1,1);
  if (uVar2 == 0) {
    if ((_nitem_local->id < (int)shares._4_4_) || ((int)(uint)shares < _nitem_local->id)) {
      local_40 = 0;
      haves._4_4_ = 0;
    }
    else {
      local_40 = remainder / (int)uVar1;
      haves._4_4_ = remainder - local_40 * uVar1;
    }
    if ((int)(_nitem_local->id - shares._4_4_) < 0) {
      local_94 = 0;
    }
    else {
      local_94 = _nitem_local->id - shares._4_4_;
    }
    if (local_94 < haves._4_4_) {
      local_40 = local_40 + 1;
    }
    *nbalanced = local_40;
    if (_nitem_local->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4b8,
             "ref_mpi_balance","malloc haves of REF_INT negative");
      ref_mpi_local._4_4_ = 1;
    }
    else {
      array = malloc((long)_nitem_local->n << 2);
      if (array == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4b8
               ,"ref_mpi_balance","malloc haves of REF_INT NULL");
        ref_mpi_local._4_4_ = 2;
      }
      else if (_nitem_local->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4b9
               ,"ref_mpi_balance","malloc shares of REF_INT negative");
        ref_mpi_local._4_4_ = 1;
      }
      else {
        _share = (REF_INT *)malloc((long)_nitem_local->n << 2);
        if (_share == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 0x4b9,"ref_mpi_balance","malloc shares of REF_INT NULL");
          ref_mpi_local._4_4_ = 2;
        }
        else {
          uVar2 = ref_mpi_allgather(_nitem_local,&local_40,_share,1);
          if (uVar2 == 0) {
            uVar2 = ref_mpi_allgather(_nitem_local,&items_local,array,1);
            if (uVar2 == 0) {
              if ((REF_INT)items_local < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                       ,0x4bd,"ref_mpi_balance","malloc destination of REF_INT negative");
                ref_mpi_local._4_4_ = 1;
              }
              else {
                proc = (REF_INT *)malloc((long)(REF_INT)items_local << 2);
                if (proc == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                         ,0x4bd,"ref_mpi_balance","malloc destination of REF_INT NULL");
                  ref_mpi_local._4_4_ = 2;
                }
                else {
                  for (local_78 = 0; local_78 < (REF_INT)items_local; local_78 = local_78 + 1) {
                    proc[local_78] = 0;
                  }
                  i = 0;
                  for (active = 0; active < _nitem_local->id; active = active + 1) {
                    i = *(int *)((long)array + (long)active * 4) + i;
                  }
                  for (ref_private_macro_code_rss = 0;
                      ref_private_macro_code_rss < (REF_INT)items_local;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    RVar3 = find_destination(_nitem_local->n,_share,i + ref_private_macro_code_rss);
                    proc[ref_private_macro_code_rss] = RVar3;
                  }
                  uVar2 = ref_mpi_blindsend(_nitem_local,proc,_last_rank_local,items_local._4_4_,
                                            (REF_INT)items_local,balanced,nbalanced,type);
                  if (uVar2 == 0) {
                    lVar4 = (long)*nbalanced;
                    if (local_40 == lVar4) {
                      if (proc != (REF_INT *)0x0) {
                        free(proc);
                      }
                      if (_share != (REF_INT *)0x0) {
                        free(_share);
                      }
                      if (array != (void *)0x0) {
                        free(array);
                      }
                      ref_mpi_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                             ,0x4d1,"ref_mpi_balance","share mismatch",(long)local_40,lVar4);
                      printf("rank %d first %d last %d active %d total %d rem %d share %d nitem %d\n"
                             ,(ulong)(uint)_nitem_local->id,(ulong)shares._4_4_,(ulong)(uint)shares,
                             (ulong)uVar1,(ulong)(uint)remainder,
                             CONCAT44((int)((ulong)lVar4 >> 0x20),haves._4_4_),local_40,
                             (REF_INT)items_local);
                      for (ref_private_macro_code_rss = 0;
                          ref_private_macro_code_rss < _nitem_local->n;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        printf(" %d",(ulong)(uint)_share[ref_private_macro_code_rss]);
                      }
                      printf("\n");
                      ref_mpi_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                           ,0x4c8,"ref_mpi_balance",(ulong)uVar2,"blind send node");
                    ref_mpi_local._4_4_ = uVar2;
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,0x4bb,"ref_mpi_balance",(ulong)uVar2,"all share");
              ref_mpi_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x4ba,"ref_mpi_balance",(ulong)uVar2,"all share");
            ref_mpi_local._4_4_ = uVar2;
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4aa,
           "ref_mpi_balance",(ulong)uVar2,"total items");
    ref_mpi_local._4_4_ = uVar2;
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_balance(REF_MPI ref_mpi, REF_INT ldim, REF_INT nitem,
                                   void *items, REF_INT first_rank,
                                   REF_INT last_rank, REF_INT *nbalanced,
                                   void **balanced, REF_TYPE type) {
  REF_INT *shares, total, share, remainder;
  REF_INT *haves;
  REF_INT *destination, offset, part, i;
  REF_INT active;

  active = last_rank - first_rank + 1;

  total = nitem;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_INT_TYPE), "total items");
  if (first_rank <= ref_mpi_rank(ref_mpi) &&
      ref_mpi_rank(ref_mpi) <= last_rank) {
    share = total / active;
    remainder = total - share * active;
  } else {
    share = 0;
    remainder = 0;
  }
  if (MAX(0, ref_mpi_rank(ref_mpi) - first_rank) < remainder) {
    share++;
  }
  *nbalanced = share;

  ref_malloc(haves, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(shares, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &share, shares, REF_INT_TYPE), "all share");
  RSS(ref_mpi_allgather(ref_mpi, &nitem, haves, REF_INT_TYPE), "all share");

  ref_malloc_init(destination, nitem, REF_INT, 0);
  offset = 0;
  for (part = 0; part < ref_mpi_rank(ref_mpi); part++) {
    offset += haves[part];
  }
  for (i = 0; i < nitem; i++) {
    destination[i] = find_destination(ref_mpi_n(ref_mpi), shares, offset + i);
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, items, ldim, nitem, balanced,
                        nbalanced, type),
      "blind send node");
  REIB(share, *nbalanced, "share mismatch", {
    printf(
        "rank %d first %d last %d active %d total %d rem %d share %d nitem "
        "%d\n",
        ref_mpi_rank(ref_mpi), first_rank, last_rank, active, total, remainder,
        share, nitem);
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) printf(" %d", shares[i]);
    printf("\n");
  });

  ref_free(destination);
  ref_free(shares);
  ref_free(haves);

  return REF_SUCCESS;
}